

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void diffwtd_mask(uint8_t *mask,int which_inverse,int mask_base,uint8_t *src0,int src0_stride,
                 uint8_t *src1,int src1_stride,int h,int w)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  int diff;
  int m;
  int j;
  int i;
  char local_3c;
  int local_30;
  int local_2c;
  
  for (local_2c = 0; local_2c < diff; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < j; local_30 = local_30 + 1) {
      iVar1 = (uint)*(byte *)(in_RCX + (local_2c * in_R8D + local_30)) -
              (uint)*(byte *)(in_R9 + (local_2c * in_stack_00000008 + local_30));
      if (iVar1 < 1) {
        iVar1 = -iVar1;
      }
      iVar1 = clamp(in_EDX + iVar1 / 0x10,0,0x40);
      local_3c = (char)iVar1;
      if (in_ESI != 0) {
        local_3c = '@' - local_3c;
      }
      *(char *)(in_RDI + (local_2c * j + local_30)) = local_3c;
    }
  }
  return;
}

Assistant:

static inline void diffwtd_mask(uint8_t *mask, int which_inverse, int mask_base,
                                const uint8_t *src0, int src0_stride,
                                const uint8_t *src1, int src1_stride, int h,
                                int w) {
  int i, j, m, diff;
  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; ++j) {
      diff =
          abs((int)src0[i * src0_stride + j] - (int)src1[i * src1_stride + j]);
      m = clamp(mask_base + (diff / DIFF_FACTOR), 0, AOM_BLEND_A64_MAX_ALPHA);
      mask[i * w + j] = which_inverse ? AOM_BLEND_A64_MAX_ALPHA - m : m;
    }
  }
}